

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

char * arg_strptime(char *buf,char *fmt,tm *tm)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  ushort **ppuVar4;
  size_t sVar5;
  tm *ptVar6;
  int local_48;
  int split_year;
  int i;
  int alt_format;
  size_t len;
  char *bp;
  tm *ptStack_28;
  char c;
  tm *tm_local;
  char *fmt_local;
  char *buf_local;
  
  _i = 0;
  bVar2 = false;
  len = (size_t)buf;
  ptStack_28 = tm;
  tm_local = (tm *)fmt;
  fmt_local = buf;
LAB_001052cb:
  while( true ) {
    bp._7_1_ = (char)tm_local->tm_sec;
    if (bp._7_1_ == '\0') {
      return (char *)len;
    }
    split_year = 0;
    ppuVar4 = __ctype_b_loc();
    if (((*ppuVar4)[(int)bp._7_1_] & 0x2000) == 0) break;
    while (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)*(char *)len] & 0x2000) != 0) {
      len = len + 1;
    }
    tm_local = (tm *)((long)&tm_local->tm_sec + 1);
  }
  ptVar6 = (tm *)((long)&tm_local->tm_sec + 1);
  bp._7_1_ = (char)tm_local->tm_sec;
  tm_local = ptVar6;
  if (bp._7_1_ == '%') goto LAB_00105362;
  goto LAB_001053a0;
LAB_00105362:
  ptVar6 = (tm *)((long)&tm_local->tm_sec + 1);
  bp._7_1_ = (char)tm_local->tm_sec;
  tm_local = ptVar6;
  switch(bp._7_1_) {
  case '%':
    goto switchD_0010539c_caseD_25;
  default:
    return (char *)0x0;
  case 'A':
  case 'a':
    if (split_year != 0) {
      return (char *)0x0;
    }
    local_48 = 0;
    goto LAB_00105636;
  case 'B':
  case 'b':
  case 'h':
    if (split_year != 0) {
      return (char *)0x0;
    }
    local_48 = 0;
    goto LAB_00105713;
  case 'C':
    if ((split_year & 0xfffffffeU) != 0) {
      return (char *)0x0;
    }
    iVar3 = conv_num((char **)&len,&local_48,0,99);
    if (iVar3 == 0) {
      return (char *)0x0;
    }
    if (bVar2) {
      ptStack_28->tm_year = ptStack_28->tm_year % 100 + local_48 * 100;
    }
    else {
      ptStack_28->tm_year = local_48 * 100;
      bVar2 = true;
    }
    break;
  case 'D':
    if (split_year != 0) {
      return (char *)0x0;
    }
    len = (size_t)arg_strptime((char *)len,"%m/%d/%y",ptStack_28);
    if ((char *)len == (char *)0x0) {
      return (char *)0x0;
    }
    break;
  case 'E':
    if (split_year != 0) {
      return (char *)0x0;
    }
    split_year = 1;
    goto LAB_00105362;
  case 'M':
    if ((split_year & 0xfffffffdU) != 0) {
      return (char *)0x0;
    }
    iVar3 = conv_num((char **)&len,&ptStack_28->tm_min,0,0x3b);
    if (iVar3 == 0) {
      return (char *)0x0;
    }
    break;
  case 'O':
    if (split_year != 0) {
      return (char *)0x0;
    }
    split_year = 2;
    goto LAB_00105362;
  case 'R':
    if (split_year != 0) {
      return (char *)0x0;
    }
    len = (size_t)arg_strptime((char *)len,"%H:%M",ptStack_28);
    if ((char *)len == (char *)0x0) {
      return (char *)0x0;
    }
    break;
  case 'S':
    if ((split_year & 0xfffffffdU) != 0) {
      return (char *)0x0;
    }
    iVar3 = conv_num((char **)&len,&ptStack_28->tm_sec,0,0x3d);
    if (iVar3 == 0) {
      return (char *)0x0;
    }
    break;
  case 'T':
    if (split_year != 0) {
      return (char *)0x0;
    }
    len = (size_t)arg_strptime((char *)len,"%H:%M:%S",ptStack_28);
    if ((char *)len == (char *)0x0) {
      return (char *)0x0;
    }
    break;
  case 'U':
  case 'W':
    if ((split_year & 0xfffffffdU) != 0) {
      return (char *)0x0;
    }
    iVar3 = conv_num((char **)&len,&local_48,0,0x35);
    if (iVar3 == 0) {
      return (char *)0x0;
    }
    break;
  case 'X':
    if ((split_year & 0xfffffffeU) != 0) {
      return (char *)0x0;
    }
    len = (size_t)arg_strptime((char *)len,"%H:%M:%S",ptStack_28);
    if ((char *)len == (char *)0x0) {
      return (char *)0x0;
    }
    break;
  case 'Y':
    if ((split_year & 0xfffffffeU) != 0) {
      return (char *)0x0;
    }
    iVar3 = conv_num((char **)&len,&local_48,0,9999);
    if (iVar3 == 0) {
      return (char *)0x0;
    }
    ptStack_28->tm_year = local_48 + -0x76c;
    break;
  case 'c':
    if ((split_year & 0xfffffffeU) != 0) {
      return (char *)0x0;
    }
    len = (size_t)arg_strptime((char *)len,"%x %X",ptStack_28);
    if ((char *)len == (char *)0x0) {
      return (char *)0x0;
    }
    break;
  case 'd':
  case 'e':
    if ((split_year & 0xfffffffdU) != 0) {
      return (char *)0x0;
    }
    iVar3 = conv_num((char **)&len,&ptStack_28->tm_mday,1,0x1f);
    if (iVar3 == 0) {
      return (char *)0x0;
    }
    break;
  case 'j':
    if (split_year != 0) {
      return (char *)0x0;
    }
    iVar3 = conv_num((char **)&len,&local_48,1,0x16e);
    if (iVar3 == 0) {
      return (char *)0x0;
    }
    ptStack_28->tm_yday = local_48 + -1;
    break;
  case 'k':
    if (split_year != 0) {
      return (char *)0x0;
    }
  case 'H':
    if ((split_year & 0xfffffffdU) != 0) {
      return (char *)0x0;
    }
    iVar3 = conv_num((char **)&len,&ptStack_28->tm_hour,0,0x17);
    if (iVar3 == 0) {
      return (char *)0x0;
    }
    break;
  case 'l':
    if (split_year != 0) {
      return (char *)0x0;
    }
  case 'I':
    if ((split_year & 0xfffffffdU) != 0) {
      return (char *)0x0;
    }
    iVar3 = conv_num((char **)&len,&ptStack_28->tm_hour,1,0xc);
    if (iVar3 == 0) {
      return (char *)0x0;
    }
    if (ptStack_28->tm_hour == 0xc) {
      ptStack_28->tm_hour = 0;
    }
    break;
  case 'm':
    if ((split_year & 0xfffffffdU) != 0) {
      return (char *)0x0;
    }
    iVar3 = conv_num((char **)&len,&local_48,1,0xc);
    if (iVar3 == 0) {
      return (char *)0x0;
    }
    ptStack_28->tm_mon = local_48 + -1;
    break;
  case 'n':
  case 't':
    if (split_year != 0) {
      return (char *)0x0;
    }
    while (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)*(char *)len] & 0x2000) != 0) {
      len = len + 1;
    }
    break;
  case 'p':
    if (split_year != 0) {
      return (char *)0x0;
    }
    iVar3 = arg_strcasecmp(am_pm[0],(char *)len);
    if (iVar3 == 0) {
      if (0xb < ptStack_28->tm_hour) {
        return (char *)0x0;
      }
      sVar5 = strlen(am_pm[0]);
      len = sVar5 + len;
    }
    else {
      iVar3 = arg_strcasecmp(am_pm[1],(char *)len);
      if (iVar3 != 0) {
        return (char *)0x0;
      }
      if (0xb < ptStack_28->tm_hour) {
        return (char *)0x0;
      }
      ptStack_28->tm_hour = ptStack_28->tm_hour + 0xc;
      sVar5 = strlen(am_pm[1]);
      len = sVar5 + len;
    }
    break;
  case 'r':
    if (split_year != 0) {
      return (char *)0x0;
    }
    len = (size_t)arg_strptime((char *)len,"%I:%M:%S %p",ptStack_28);
    if ((char *)len == (char *)0x0) {
      return (char *)0x0;
    }
    break;
  case 'w':
    if ((split_year & 0xfffffffdU) != 0) {
      return (char *)0x0;
    }
    iVar3 = conv_num((char **)&len,&ptStack_28->tm_wday,0,6);
    if (iVar3 == 0) {
      return (char *)0x0;
    }
    break;
  case 'x':
    if ((split_year & 0xfffffffeU) != 0) {
      return (char *)0x0;
    }
    len = (size_t)arg_strptime((char *)len,"%m/%d/%y",ptStack_28);
    if ((char *)len == (char *)0x0) {
      return (char *)0x0;
    }
    break;
  case 'y':
    if ((split_year & 0xfffffffcU) != 0) {
      return (char *)0x0;
    }
    iVar3 = conv_num((char **)&len,&local_48,0,99);
    if (iVar3 == 0) {
      return (char *)0x0;
    }
    if (bVar2) {
      ptStack_28->tm_year = (ptStack_28->tm_year / 100) * 100 + local_48;
    }
    else {
      bVar2 = true;
      if (local_48 < 0x45) {
        ptStack_28->tm_year = local_48 + 100;
      }
      else {
        ptStack_28->tm_year = local_48;
      }
    }
  }
  goto LAB_001052cb;
LAB_00105713:
  if (0xb < local_48) goto LAB_001057a3;
  _i = strlen(mon[local_48]);
  iVar3 = arg_strncasecmp(mon[local_48],(char *)len,_i);
  if (iVar3 == 0) goto LAB_001057a3;
  _i = strlen(abmon[local_48]);
  iVar3 = arg_strncasecmp(abmon[local_48],(char *)len,_i);
  if (iVar3 == 0) goto LAB_001057a3;
  local_48 = local_48 + 1;
  goto LAB_00105713;
LAB_001057a3:
  if (local_48 == 0xc) {
    return (char *)0x0;
  }
  ptStack_28->tm_mon = local_48;
  len = _i + len;
  goto LAB_001052cb;
LAB_00105636:
  if (6 < local_48) goto LAB_001056c6;
  _i = strlen(day[local_48]);
  iVar3 = arg_strncasecmp(day[local_48],(char *)len,_i);
  if (iVar3 == 0) goto LAB_001056c6;
  _i = strlen(abday[local_48]);
  iVar3 = arg_strncasecmp(abday[local_48],(char *)len,_i);
  if (iVar3 == 0) goto LAB_001056c6;
  local_48 = local_48 + 1;
  goto LAB_00105636;
LAB_001056c6:
  if (local_48 == 7) {
    return (char *)0x0;
  }
  ptStack_28->tm_wday = local_48;
  len = _i + len;
  goto LAB_001052cb;
switchD_0010539c_caseD_25:
LAB_001053a0:
  cVar1 = *(char *)len;
  len = len + 1;
  if (bp._7_1_ != cVar1) {
    return (char *)0x0;
  }
  goto LAB_001052cb;
}

Assistant:

char * arg_strptime(const char * buf, const char * fmt, struct tm * tm) {
	char c;
	const char * bp;
	size_t len = 0;
	int alt_format, i, split_year = 0;

	bp = buf;

	while ((c = *fmt) != '\0') {
		/* Clear `alternate' modifier prior to new conversion. */
		alt_format = 0;

		/* Eat up white-space. */
		if (isspace(c)) {
			while (isspace(*bp)) {
				bp++;
			}

			fmt++;
			continue;
		}

		if ((c = *fmt++) != '%') {
			goto literal;
		}


again:

		switch (c = *fmt++) {
			case '%': /* "%%" is converted to "%". */
literal:
				if (c != *bp++) {
					return (0);
				}

				break;

			/*
			 * "Alternative" modifiers. Just set the appropriate flag
			 * and start over again.
			 */
			case 'E': /* "%E?" alternative conversion modifier. */
				LEGAL_ALT(0);
				alt_format |= ALT_E;
				goto again;

			case 'O': /* "%O?" alternative conversion modifier. */
				LEGAL_ALT(0);
				alt_format |= ALT_O;
				goto again;

			/*
			 * "Complex" conversion rules, implemented through recursion.
			 */
			case 'c': /* Date and time, using the locale's format. */
				LEGAL_ALT(ALT_E);
				bp = arg_strptime(bp, "%x %X", tm);

				if (!bp) {
					return (0);
				}

				break;

			case 'D': /* The date as "%m/%d/%y". */
				LEGAL_ALT(0);
				bp = arg_strptime(bp, "%m/%d/%y", tm);

				if (!bp) {
					return (0);
				}

				break;

			case 'R': /* The time as "%H:%M". */
				LEGAL_ALT(0);
				bp = arg_strptime(bp, "%H:%M", tm);

				if (!bp) {
					return (0);
				}

				break;

			case 'r': /* The time in 12-hour clock representation. */
				LEGAL_ALT(0);
				bp = arg_strptime(bp, "%I:%M:%S %p", tm);

				if (!bp) {
					return (0);
				}

				break;

			case 'T': /* The time as "%H:%M:%S". */
				LEGAL_ALT(0);
				bp = arg_strptime(bp, "%H:%M:%S", tm);

				if (!bp) {
					return (0);
				}

				break;

			case 'X': /* The time, using the locale's format. */
				LEGAL_ALT(ALT_E);
				bp = arg_strptime(bp, "%H:%M:%S", tm);

				if (!bp) {
					return (0);
				}

				break;

			case 'x': /* The date, using the locale's format. */
				LEGAL_ALT(ALT_E);
				bp = arg_strptime(bp, "%m/%d/%y", tm);

				if (!bp) {
					return (0);
				}

				break;

			/*
			 * "Elementary" conversion rules.
			 */
			case 'A': /* The day of week, using the locale's form. */
			case 'a':
				LEGAL_ALT(0);

				for (i = 0; i < 7; i++) {
					/* Full name. */
					len = strlen(day[i]);

					if (arg_strncasecmp(day[i], bp, len) == 0) {
						break;
					}

					/* Abbreviated name. */
					len = strlen(abday[i]);

					if (arg_strncasecmp(abday[i], bp, len) == 0) {
						break;
					}
				}

				/* Nothing matched. */
				if (i == 7) {
					return (0);
				}

				tm->tm_wday = i;
				bp += len;
				break;

			case 'B': /* The month, using the locale's form. */
			case 'b':
			case 'h':
				LEGAL_ALT(0);

				for (i = 0; i < 12; i++) {
					/* Full name. */
					len = strlen(mon[i]);

					if (arg_strncasecmp(mon[i], bp, len) == 0) {
						break;
					}

					/* Abbreviated name. */
					len = strlen(abmon[i]);

					if (arg_strncasecmp(abmon[i], bp, len) == 0) {
						break;
					}
				}

				/* Nothing matched. */
				if (i == 12) {
					return (0);
				}

				tm->tm_mon = i;
				bp += len;
				break;

			case 'C': /* The century number. */
				LEGAL_ALT(ALT_E);

				if (!(conv_num(&bp, &i, 0, 99))) {
					return (0);
				}

				if (split_year) {
					tm->tm_year = (tm->tm_year % 100) + (i * 100);
				} else {
					tm->tm_year = i * 100;
					split_year = 1;
				}

				break;

			case 'd': /* The day of month. */
			case 'e':
				LEGAL_ALT(ALT_O);

				if (!(conv_num(&bp, &tm->tm_mday, 1, 31))) {
					return (0);
				}

				break;

			case 'k': /* The hour (24-hour clock representation). */
				LEGAL_ALT(0);

			/* FALLTHROUGH */
			case 'H':
				LEGAL_ALT(ALT_O);

				if (!(conv_num(&bp, &tm->tm_hour, 0, 23))) {
					return (0);
				}

				break;

			case 'l': /* The hour (12-hour clock representation). */
				LEGAL_ALT(0);

			/* FALLTHROUGH */
			case 'I':
				LEGAL_ALT(ALT_O);

				if (!(conv_num(&bp, &tm->tm_hour, 1, 12))) {
					return (0);
				}

				if (tm->tm_hour == 12) {
					tm->tm_hour = 0;
				}

				break;

			case 'j': /* The day of year. */
				LEGAL_ALT(0);

				if (!(conv_num(&bp, &i, 1, 366))) {
					return (0);
				}

				tm->tm_yday = i - 1;
				break;

			case 'M': /* The minute. */
				LEGAL_ALT(ALT_O);

				if (!(conv_num(&bp, &tm->tm_min, 0, 59))) {
					return (0);
				}

				break;

			case 'm': /* The month. */
				LEGAL_ALT(ALT_O);

				if (!(conv_num(&bp, &i, 1, 12))) {
					return (0);
				}

				tm->tm_mon = i - 1;
				break;

			case 'p': /* The locale's equivalent of AM/PM. */
				LEGAL_ALT(0);

				/* AM? */
				if (arg_strcasecmp(am_pm[0], bp) == 0) {
					if (tm->tm_hour > 11) {
						return (0);
					}

					bp += strlen(am_pm[0]);
					break;
				}
				/* PM? */
				else if (arg_strcasecmp(am_pm[1], bp) == 0) {
					if (tm->tm_hour > 11) {
						return (0);
					}

					tm->tm_hour += 12;
					bp += strlen(am_pm[1]);
					break;
				}

				/* Nothing matched. */
				return (0);

			case 'S': /* The seconds. */
				LEGAL_ALT(ALT_O);

				if (!(conv_num(&bp, &tm->tm_sec, 0, 61))) {
					return (0);
				}

				break;

			case 'U': /* The week of year, beginning on sunday. */
			case 'W': /* The week of year, beginning on monday. */
				LEGAL_ALT(ALT_O);

				/*
				 * XXX This is bogus, as we can not assume any valid
				 * information present in the tm structure at this
				 * point to calculate a real value, so just check the
				 * range for now.
				 */
				if (!(conv_num(&bp, &i, 0, 53))) {
					return (0);
				}

				break;

			case 'w': /* The day of week, beginning on sunday. */
				LEGAL_ALT(ALT_O);

				if (!(conv_num(&bp, &tm->tm_wday, 0, 6))) {
					return (0);
				}

				break;

			case 'Y': /* The year. */
				LEGAL_ALT(ALT_E);

				if (!(conv_num(&bp, &i, 0, 9999))) {
					return (0);
				}

				tm->tm_year = i - TM_YEAR_BASE;
				break;

			case 'y': /* The year within 100 years of the epoch. */
				LEGAL_ALT(ALT_E | ALT_O);

				if (!(conv_num(&bp, &i, 0, 99))) {
					return (0);
				}

				if (split_year) {
					tm->tm_year = ((tm->tm_year / 100) * 100) + i;
					break;
				}

				split_year = 1;

				if (i <= 68) {
					tm->tm_year = i + 2000 - TM_YEAR_BASE;
				} else {
					tm->tm_year = i + 1900 - TM_YEAR_BASE;
				}

				break;

			/*
			 * Miscellaneous conversions.
			 */
			case 'n': /* Any kind of white-space. */
			case 't':
				LEGAL_ALT(0);

				while (isspace(*bp)) {
					bp++;
				}

				break;


			default: /* Unknown/unsupported conversion. */
				return (0);
		}


	}

	/* LINTED functional specification */
	return ((char *)bp);
}